

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

void sysbvm_typeAndMetatype_setFlags
               (sysbvm_context_t *context,sysbvm_tuple_t type,sysbvm_bitflags_t flags,
               sysbvm_bitflags_t metatypeFlags)

{
  ulong uVar1;
  
  uVar1 = type & 0xf;
  if (uVar1 == 0 && type != 0) {
    *(sysbvm_bitflags_t *)(type + 0x70) = flags << 4 | 0xb;
    uVar1 = *(ulong *)type;
  }
  else if ((int)uVar1 == 0xf) {
    uVar1 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,type >> 4);
  }
  else {
    uVar1 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar1);
  }
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    *(sysbvm_bitflags_t *)(uVar1 + 0x70) = metatypeFlags << 4 | 0x1b;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_typeAndMetatype_setFlags(sysbvm_context_t *context, sysbvm_tuple_t type, sysbvm_bitflags_t flags, sysbvm_bitflags_t metatypeFlags)
{
    sysbvm_type_setFlags(context, type, flags);
    sysbvm_type_setFlags(context, sysbvm_tuple_getType(context, type), SYSBVM_TYPE_FLAGS_METATYPE_REQUIRED_FLAGS | metatypeFlags);
}